

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O0

bool tcu::anon_unknown_3::pixelOnlyOnASharedEdge
               (IVec2 *pixel,SceneTriangle *triangle,IVec2 *viewportSize)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  bool pixelOnEdge2;
  bool pixelOnEdge1;
  bool pixelOnEdge0;
  Vector<float,_2> local_c0;
  Vector<float,_2> local_b8;
  Vector<float,_2> local_b0;
  Vector<float,_2> local_a8;
  Vector<float,_2> local_a0;
  Vector<float,_2> local_98;
  Vector<float,_2> local_90;
  Vector<float,_2> local_88;
  Vector<float,_2> local_80;
  Vector<float,_2> local_78;
  Vector<float,_2> local_70;
  Vec2 local_68;
  Vec2 triangleScreenSpace [3];
  Vector<float,_2> local_48;
  Vec2 triangleNormalizedDeviceSpace [3];
  IVec2 *viewportSize_local;
  SceneTriangle *triangle_local;
  IVec2 *pixel_local;
  
  if ((((triangle->sharedEdge[0] & 1U) != 0) || ((triangle->sharedEdge[1] & 1U) != 0)) ||
     ((triangle->sharedEdge[2] & 1U) != 0)) {
    fVar6 = Vector<float,_4>::x(triangle->positions);
    fVar7 = Vector<float,_4>::w(triangle->positions);
    fVar8 = Vector<float,_4>::y(triangle->positions);
    fVar9 = Vector<float,_4>::w(triangle->positions);
    Vector<float,_2>::Vector(&local_48,fVar6 / fVar7,fVar8 / fVar9);
    fVar6 = Vector<float,_4>::x(triangle->positions + 1);
    fVar7 = Vector<float,_4>::w(triangle->positions + 1);
    fVar8 = Vector<float,_4>::y(triangle->positions + 1);
    fVar9 = Vector<float,_4>::w(triangle->positions + 1);
    Vector<float,_2>::Vector(triangleNormalizedDeviceSpace,fVar6 / fVar7,fVar8 / fVar9);
    fVar6 = Vector<float,_4>::x(triangle->positions + 2);
    fVar7 = Vector<float,_4>::w(triangle->positions + 2);
    fVar8 = Vector<float,_4>::y(triangle->positions + 2);
    fVar9 = Vector<float,_4>::w(triangle->positions + 2);
    Vector<float,_2>::Vector(triangleNormalizedDeviceSpace + 1,fVar6 / fVar7,fVar8 / fVar9);
    Vector<float,_2>::Vector(&local_80,1.0,1.0);
    tcu::operator+((tcu *)&local_78,&local_48,&local_80);
    tcu::operator*((tcu *)&local_70,&local_78,0.5);
    iVar4 = Vector<int,_2>::x(viewportSize);
    iVar5 = Vector<int,_2>::y(viewportSize);
    Vector<float,_2>::Vector(&local_88,(float)iVar4,(float)iVar5);
    tcu::operator*((tcu *)&local_68,&local_70,&local_88);
    Vector<float,_2>::Vector(&local_a0,1.0,1.0);
    tcu::operator+((tcu *)&local_98,triangleNormalizedDeviceSpace,&local_a0);
    tcu::operator*((tcu *)&local_90,&local_98,0.5);
    iVar4 = Vector<int,_2>::x(viewportSize);
    iVar5 = Vector<int,_2>::y(viewportSize);
    Vector<float,_2>::Vector(&local_a8,(float)iVar4,(float)iVar5);
    tcu::operator*((tcu *)triangleScreenSpace,&local_90,&local_a8);
    Vector<float,_2>::Vector(&local_c0,1.0,1.0);
    tcu::operator+((tcu *)&local_b8,triangleNormalizedDeviceSpace + 1,&local_c0);
    tcu::operator*((tcu *)&local_b0,&local_b8,0.5);
    iVar4 = Vector<int,_2>::x(viewportSize);
    iVar5 = Vector<int,_2>::y(viewportSize);
    Vector<float,_2>::Vector((Vector<float,_2> *)&stack0xffffffffffffff38,(float)iVar4,(float)iVar5)
    ;
    tcu::operator*((tcu *)(triangleScreenSpace + 1),&local_b0,
                   (Vector<float,_2> *)&stack0xffffffffffffff38);
    bVar1 = pixelNearLineSegment(pixel,&local_68,triangleScreenSpace);
    bVar2 = pixelNearLineSegment(pixel,triangleScreenSpace,triangleScreenSpace + 1);
    bVar3 = pixelNearLineSegment(pixel,triangleScreenSpace + 1,&local_68);
    if (((bVar1) && (!bVar2)) && (!bVar3)) {
      return (bool)(triangle->sharedEdge[0] & 1);
    }
    if (((!bVar1) && (bVar2)) && (!bVar3)) {
      return (bool)(triangle->sharedEdge[1] & 1);
    }
    if (((!bVar1) && (!bVar2)) && (bVar3)) {
      return (bool)(triangle->sharedEdge[2] & 1);
    }
  }
  return false;
}

Assistant:

bool pixelOnlyOnASharedEdge (const tcu::IVec2& pixel, const TriangleSceneSpec::SceneTriangle& triangle, const tcu::IVec2& viewportSize)
{
	if (triangle.sharedEdge[0] || triangle.sharedEdge[1] || triangle.sharedEdge[2])
	{
		const tcu::Vec2 triangleNormalizedDeviceSpace[3] =
		{
			tcu::Vec2(triangle.positions[0].x() / triangle.positions[0].w(), triangle.positions[0].y() / triangle.positions[0].w()),
			tcu::Vec2(triangle.positions[1].x() / triangle.positions[1].w(), triangle.positions[1].y() / triangle.positions[1].w()),
			tcu::Vec2(triangle.positions[2].x() / triangle.positions[2].w(), triangle.positions[2].y() / triangle.positions[2].w()),
		};
		const tcu::Vec2 triangleScreenSpace[3] =
		{
			(triangleNormalizedDeviceSpace[0] + tcu::Vec2(1.0f, 1.0f)) * 0.5f * tcu::Vec2((float)viewportSize.x(), (float)viewportSize.y()),
			(triangleNormalizedDeviceSpace[1] + tcu::Vec2(1.0f, 1.0f)) * 0.5f * tcu::Vec2((float)viewportSize.x(), (float)viewportSize.y()),
			(triangleNormalizedDeviceSpace[2] + tcu::Vec2(1.0f, 1.0f)) * 0.5f * tcu::Vec2((float)viewportSize.x(), (float)viewportSize.y()),
		};

		const bool pixelOnEdge0 = pixelNearLineSegment(pixel, triangleScreenSpace[0], triangleScreenSpace[1]);
		const bool pixelOnEdge1 = pixelNearLineSegment(pixel, triangleScreenSpace[1], triangleScreenSpace[2]);
		const bool pixelOnEdge2 = pixelNearLineSegment(pixel, triangleScreenSpace[2], triangleScreenSpace[0]);

		// If the pixel is on a multiple edges return false

		if (pixelOnEdge0 && !pixelOnEdge1 && !pixelOnEdge2)
			return triangle.sharedEdge[0];
		if (!pixelOnEdge0 && pixelOnEdge1 && !pixelOnEdge2)
			return triangle.sharedEdge[1];
		if (!pixelOnEdge0 && !pixelOnEdge1 && pixelOnEdge2)
			return triangle.sharedEdge[2];
	}

	return false;
}